

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall State::State(State *this)

{
  Incppect<false> *pIVar1;
  long *local_58 [2];
  long local_48 [2];
  State *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  this->t = 0.0;
  this->dt = 0.001;
  this->energy = 0.0;
  (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.dt","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:39:49)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:39:49)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.nballs","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:41:53)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:41:53)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.dt","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:47:49)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:47:49)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.energy","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:48:53)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:48:53)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.ball[%d].r","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:50:57)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:50:57)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.ball[%d].m","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:51:57)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:51:57)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.ball[%d].x","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:52:57)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:52:57)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.ball[%d].y","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:53:57)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:53:57)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.ball[%d].z","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:54:57)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:54:57)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.ball[%d].vx","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:55:58)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:55:58)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.ball[%d].vy","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:56:58)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:56:58)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar1 = Incppect<false>::getInstance();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"state.ball[%d].vz","");
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:57:58)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/balls3d/main.cpp:57:58)>
             ::_M_manager;
  local_38 = this;
  Incppect<false>::var((string *)pIVar1,(function *)local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

State() {
        incppect::getInstance().var("state.dt", [this](const auto & idxs) { return incppect::view(dt); });

        incppect::getInstance().var("state.nballs", [this](const auto & idxs) {
            static int n = 0;
            n = balls.size();
            return incppect::view(n);
        });

        incppect::getInstance().var("state.dt", [this](const auto & idxs) { return incppect::view(dt); });
        incppect::getInstance().var("state.energy", [this](const auto & idxs) { return incppect::view(energy); });

        incppect::getInstance().var("state.ball[%d].r", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].r); });
        incppect::getInstance().var("state.ball[%d].m", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].m); });
        incppect::getInstance().var("state.ball[%d].x", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].x); });
        incppect::getInstance().var("state.ball[%d].y", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].y); });
        incppect::getInstance().var("state.ball[%d].z", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].z); });
        incppect::getInstance().var("state.ball[%d].vx", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].vx); });
        incppect::getInstance().var("state.ball[%d].vy", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].vy); });
        incppect::getInstance().var("state.ball[%d].vz", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].vz); });
    }